

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx::create_group_ops(ConvolutionDepthWise_x86_avx *this,Option *opt)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  _func_int *p_Var5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined8 *puVar10;
  void **ppvVar11;
  Allocator **ppAVar12;
  int i;
  uint uVar13;
  pointer ppLVar14;
  Layer *pLVar15;
  long lVar16;
  _func_int **pp_Var17;
  ulong uVar18;
  int iVar19;
  pointer ppLVar20;
  long lVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [32];
  undefined1 auVar26 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar38 [16];
  undefined1 in_ZMM11 [64];
  Mat weight_data_int8_scales_g;
  Mat weight_data_g;
  ParamDict pd;
  Mat local_348;
  Allocator *local_2f8;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 local_2e8;
  undefined4 uStack_2e4;
  int local_2e0;
  Allocator *local_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  int local_2c0;
  size_t local_2b8;
  int local_2ac;
  Allocator *local_2a8;
  int iStack_2a0;
  undefined4 uStack_29c;
  int local_298;
  int iStack_294;
  uint local_290;
  Allocator *local_288;
  uint uStack_280;
  int iStack_27c;
  uint uStack_278;
  uint uStack_274;
  uint uStack_270;
  size_t local_268;
  void *local_258;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  undefined4 local_248;
  undefined4 uStack_244;
  int local_240;
  undefined1 auStack_23c [4];
  Allocator *local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  int local_220;
  undefined1 auStack_21c [4];
  size_t local_218;
  undefined1 local_208 [48];
  undefined8 uStack_1d8;
  int local_1d0 [2];
  size_t local_1c8;
  Allocator *local_1c0;
  int iStack_1b8;
  undefined4 uStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  uint uStack_1a8;
  Allocator *local_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  uint local_188;
  size_t local_180;
  Allocator *local_178;
  int *piStack_170;
  undefined8 uStack_168;
  int iStack_160;
  Allocator *local_158;
  undefined8 local_150;
  undefined8 uStack_148;
  int local_140;
  size_t local_138;
  void *local_130;
  int *piStack_128;
  undefined8 uStack_120;
  int iStack_118;
  Allocator *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  int local_f8;
  size_t local_f0;
  void *local_e8;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  int iStack_d0;
  Allocator *local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  int local_b0;
  size_t local_a8;
  undefined8 *local_a0;
  void **local_98;
  undefined8 *local_90;
  Allocator **local_88;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *local_80;
  size_t local_78;
  undefined1 *local_70;
  size_t local_68;
  Option *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ParamDict local_40;
  
  ppLVar20 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  p_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
  iVar19 = *(int *)(&this->field_0xd8 + (long)p_Var5) * *(int *)(&this->field_0xd4 + (long)p_Var5);
  iVar2 = *(int *)(&this->field_0xd0 + (long)p_Var5);
  iVar3 = *(int *)(&this->field_0x108 + (long)p_Var5);
  uVar18 = (long)*(int *)(&this->field_0x104 + (long)p_Var5) / (long)iVar3;
  uVar18 = (long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) / (long)iVar19;
  ppLVar14 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  local_60 = opt;
  if (0 < (int)((ulong)((long)ppLVar14 - (long)ppLVar20) >> 3)) {
    lVar21 = 0;
    do {
      if (ppLVar20[lVar21] != (Layer *)0x0) {
        (*ppLVar20[lVar21]->_vptr_Layer[1])();
      }
      lVar21 = lVar21 + 1;
      ppLVar20 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      ppLVar14 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    } while (lVar21 < (int)((ulong)((long)ppLVar14 - (long)ppLVar20) >> 3));
  }
  local_80 = &this->group_ops;
  if (ppLVar14 != ppLVar20) {
    (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppLVar20;
  }
  iVar4 = *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]);
  i = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) / iVar4;
  std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize(local_80,(long)iVar4);
  pp_Var17 = this->_vptr_ConvolutionDepthWise_x86_avx;
  if (0 < *(int *)(&this->field_0x108 + (long)pp_Var17[-3])) {
    local_70 = &this->field_0x118;
    local_2ac = iVar19 * i *
                (((int)((long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                       (long)(iVar2 / iVar3)) * iVar3) / iVar4);
    local_68 = (size_t)local_2ac;
    local_78 = (size_t)i;
    local_88 = &local_178;
    local_90 = &local_150;
    local_98 = &local_130;
    local_a0 = &local_108;
    local_58 = 0x8000000000000000;
    uStack_50 = 0x8000000000000000;
    lVar21 = 0;
    do {
      auVar38 = in_ZMM11._0_16_;
      auVar37 = in_ZMM10._0_16_;
      pp_Var17 = pp_Var17 + -3;
      p_Var5 = *pp_Var17;
      lVar16 = *(long *)(&this->field_0x178 + (long)p_Var5);
      local_258 = (void *)(lVar21 * local_68 * lVar16 + *(long *)(&this->field_0x168 + (long)p_Var5)
                          );
      local_240 = *(int *)(&this->field_0x180 + (long)p_Var5);
      local_238 = *(Allocator **)(&this->field_0x188 + (long)p_Var5);
      local_248 = (undefined4)lVar16;
      uStack_244 = (undefined4)((ulong)lVar16 >> 0x20);
      local_230 = CONCAT44((int)local_68,1);
      local_268 = 0;
      local_2a8 = (Allocator *)0x0;
      local_298 = 0;
      iStack_294 = 0;
      local_290 = 0;
      local_288 = (Allocator *)0x0;
      iStack_27c = 0;
      bVar22 = *(int *)(&this->field_0x100 + (long)*pp_Var17) != 0;
      if (bVar22) {
        p_Var5 = *pp_Var17;
        lVar16 = *(long *)(&this->field_0x1c0 + (long)p_Var5);
        local_2a8 = (Allocator *)
                    (lVar21 * local_78 * lVar16 + *(long *)(&this->field_0x1b0 + (long)p_Var5));
        local_290 = *(uint *)(&this->field_0x1c8 + (long)p_Var5);
        local_288 = *(Allocator **)(&this->field_0x1d0 + (long)p_Var5);
        local_208._16_4_ = (undefined4)lVar16;
        local_208._20_4_ = (undefined4)((ulong)lVar16 >> 0x20);
        local_268 = local_78;
        iStack_294 = local_208._20_4_;
        local_298 = local_208._16_4_;
        local_1c8 = 0;
        local_208._0_8_ = (void *)0x0;
        local_208._8_4_ = 0;
        local_208._12_4_ = 0;
        local_208._16_4_ = 0;
        local_208._20_4_ = 0;
        local_208._24_4_ = 0;
        stack0xfffffffffffffe20 = ZEXT816(0);
        local_1d0[0] = 0;
        iStack_27c = i;
        local_208._32_8_ = local_288;
      }
      uStack_270 = (uint)bVar22;
      uStack_274 = (uint)bVar22;
      uStack_278 = (uint)bVar22;
      uStack_280 = (uint)bVar22;
      local_218 = local_68;
      local_220 = 1;
      uStack_228 = 0x100000001;
      uStack_24c = 0;
      uStack_250 = 0;
      uStack_29c = 0;
      iStack_2a0 = 0;
      pLVar15 = create_layer(6);
      ParamDict::ParamDict(&local_40);
      ParamDict::set(&local_40,0,i);
      ParamDict::set(&local_40,1,
                     *(int *)(&this->field_0xd4 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,0xb,
                     *(int *)(&this->field_0xd8 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,2,
                     *(int *)(&this->field_0xdc + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,0xc,
                     *(int *)(&this->field_0xe0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,3,
                     *(int *)(&this->field_0xe4 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,0xd,
                     *(int *)(&this->field_0xe8 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]
                             ));
      ParamDict::set(&local_40,4,0);
      ParamDict::set(&local_40,0xe,0);
      ParamDict::set(&local_40,5,
                     *(int *)(&this->field_0x100 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
      ParamDict::set(&local_40,6,local_2ac);
      ParamDict::set(&local_40,8,
                     *(int *)(&this->field_0x10c +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
      ParamDict::set(&local_40,9,
                     *(int *)(&this->field_0x110 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
      ParamDict::set(&local_40,10,
                     (Mat *)(local_70 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]));
      (*pLVar15->_vptr_Layer[2])(pLVar15,&local_40);
      if (*(int *)(&this->field_0x100 + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) == 0) {
        lVar16 = 0x40;
        auVar24._0_12_ = ZEXT812(0);
        auVar24._12_4_ = 0;
        do {
          *(undefined8 *)(local_208 + lVar16) = 0;
          *(undefined1 (*) [16])((long)&local_248 + lVar16) = auVar24;
          *(undefined1 (*) [16])(auStack_23c + lVar16) = auVar24;
          *(undefined1 (*) [16])((long)&uStack_228 + lVar16) = auVar24;
          *(undefined1 (*) [16])(auStack_21c + lVar16) = auVar24;
          lVar16 = lVar16 + 0x48;
        } while (lVar16 != 0x160);
        piVar6 = (int *)CONCAT44(uStack_24c,uStack_250);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
              if ((void *)local_208._0_8_ != (void *)0x0) {
                free((void *)local_208._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_208._32_8_)[3])();
            }
          }
        }
        local_208._0_8_ = local_258;
        local_208._8_4_ = uStack_250;
        local_208._12_4_ = uStack_24c;
        local_208._16_4_ = local_248;
        local_208._20_4_ = uStack_244;
        local_208._24_4_ = local_240;
        local_208._32_8_ = local_238;
        uStack_1d8 = uStack_228;
        local_208._40_8_ = local_230;
        local_1d0[0] = local_220;
        local_1c8 = local_218;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) != 0)
        {
          local_348.cstep = 0;
          local_348.data = (Allocator *)0x0;
          local_348.refcount._0_4_ = 0;
          local_348.refcount._4_4_ = 0;
          local_348.elemsize._0_4_ = 0;
          local_348.elempack = 0;
          local_348.elemsize._4_4_ = (int)local_348.refcount;
          local_348.allocator = (Allocator *)local_348.data;
          local_348.dims = (int)local_348.refcount;
          local_348.w = local_348.elempack;
          local_348.h = (int)local_348.elemsize;
          local_348.d = (int)local_348.refcount;
          local_348.c = local_348.elempack;
          Mat::create(&local_348,i,4,(Allocator *)0x0);
          auVar9 = _DAT_00318660;
          auVar8 = _DAT_00318640;
          uVar13 = local_348.c * (int)local_348.cstep;
          auVar7._8_8_ = uStack_50;
          auVar7._0_8_ = local_58;
          auVar37 = vpcmpeqd_avx(auVar37,auVar37);
          if (0 < (int)uVar13) {
            auVar26._8_8_ = 0;
            auVar26._0_8_ = (ulong)uVar13 - 1;
            auVar24 = vpshufd_avx(auVar26,0x44);
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) + lVar21 * 4);
            auVar28._4_4_ = uVar1;
            auVar28._0_4_ = uVar1;
            auVar28._8_4_ = uVar1;
            auVar28._12_4_ = uVar1;
            auVar28._16_4_ = uVar1;
            auVar28._20_4_ = uVar1;
            auVar28._24_4_ = uVar1;
            auVar28._28_4_ = uVar1;
            uVar18 = 0;
            do {
              auVar30._8_8_ = 0;
              auVar30._0_8_ = uVar18;
              auVar26 = vpshufd_avx(auVar30,0x44);
              auVar33._16_16_ = auVar26;
              auVar33._0_16_ = auVar26;
              auVar34 = vorps_avx(auVar33,auVar8);
              auVar33 = vorps_avx(auVar9,auVar33);
              auVar26 = vpcmpgtq_avx(auVar7 ^ auVar33._16_16_,auVar7 ^ auVar24);
              auVar30 = vpcmpgtq_avx(auVar7 ^ auVar33._0_16_,auVar7 ^ auVar24);
              auVar26 = vpackssdw_avx(auVar30,auVar26);
              auVar30 = vpcmpgtq_avx(auVar7 ^ auVar34._16_16_,auVar7 ^ auVar24);
              auVar36._0_4_ = (uint)local_58 ^ auVar34._0_4_;
              auVar36._4_4_ = (uint)((ulong)local_58 >> 0x20) ^ auVar34._4_4_;
              auVar36._8_4_ = (uint)uStack_50 ^ auVar34._8_4_;
              auVar36._12_4_ = (uint)((ulong)uStack_50 >> 0x20) ^ auVar34._12_4_;
              auVar36 = vpcmpgtq_avx(auVar36,auVar7 ^ auVar24);
              auVar30 = vpackssdw_avx(auVar36,auVar30);
              auVar26 = vpackssdw_avx(auVar37 ^ auVar30,auVar37 ^ auVar26);
              auVar30 = vpmovsxwd_avx(auVar26);
              auVar26 = vpunpckhwd_avx(auVar26,auVar26);
              auVar34._16_16_ = auVar26;
              auVar34._0_16_ = auVar30;
              auVar34 = vmaskmovps_avx(auVar34,auVar28);
              *(undefined1 (*) [32])((long)(_func_int ***)local_348.data + uVar18 * 4) = auVar34;
              uVar18 = uVar18 + 8;
            } while ((uVar13 + 7 & 0xfffffff8) != uVar18);
          }
          piVar6 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          piVar6 = (int *)CONCAT44(uStack_1b4,iStack_1b8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_1a0 == (Allocator *)0x0) {
                if (local_1c0 != (Allocator *)0x0) {
                  free(local_1c0);
                }
              }
              else {
                (*local_1a0->_vptr_Allocator[3])();
              }
            }
          }
          local_1c0 = (Allocator *)local_348.data;
          iStack_1b8 = (int)local_348.refcount;
          uStack_1b4 = local_348.refcount._4_4_;
          iStack_1b0 = (int)local_348.elemsize;
          iStack_1ac = local_348.elemsize._4_4_;
          uStack_1a8 = local_348.elempack;
          local_1a0 = local_348.allocator;
          local_198._4_4_ = local_348.w;
          local_198._0_4_ = local_348.dims;
          uStack_190._4_4_ = local_348.d;
          uStack_190._0_4_ = local_348.h;
          local_188 = local_348.c;
          local_180 = local_348.cstep;
          p_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          lVar16 = *(long *)(&this->field_0x250 + (long)p_Var5);
          local_2f8 = (Allocator *)(lVar16 * lVar21 + *(long *)(&this->field_0x240 + (long)p_Var5));
          local_2e0 = *(int *)(&this->field_0x258 + (long)p_Var5);
          local_2d8 = *(Allocator **)(&this->field_0x260 + (long)p_Var5);
          uStack_2f0 = 0;
          uStack_2ec = 0;
          local_2e8 = (undefined4)lVar16;
          uStack_2e4 = (undefined4)((ulong)lVar16 >> 0x20);
          local_2d0 = 0x100000001;
          uStack_2c8 = 0x100000001;
          local_2c0 = 1;
          local_2b8 = 1;
          if (piStack_170 != (int *)0x0) {
            LOCK();
            *piStack_170 = *piStack_170 + -1;
            UNLOCK();
            if (*piStack_170 == 0) {
              if (local_158 == (Allocator *)0x0) {
                if (local_178 != (Allocator *)0x0) {
                  free(local_178);
                }
              }
              else {
                (*local_158->_vptr_Allocator[3])();
              }
            }
          }
          ppAVar12 = local_88;
          *(undefined8 *)((long)local_88 + 0xc) = 0;
          *(undefined8 *)((long)ppAVar12 + 0x14) = 0;
          *ppAVar12 = (Allocator *)0x0;
          ppAVar12[1] = (Allocator *)0x0;
          puVar10 = local_90;
          *local_90 = 0;
          puVar10[1] = 0;
          *(undefined4 *)(puVar10 + 2) = 0;
          piVar6 = (int *)CONCAT44(uStack_2ec,uStack_2f0);
          local_178 = local_2f8;
          piStack_170 = (int *)CONCAT44(uStack_2ec,uStack_2f0);
          uStack_168 = CONCAT44(uStack_2e4,local_2e8);
          iStack_160 = local_2e0;
          local_158 = local_2d8;
          local_150 = local_2d0;
          uStack_148 = uStack_2c8;
          local_140 = local_2c0;
          local_138 = local_2b8;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2d8 == (Allocator *)0x0) {
                if (local_2f8 != (Allocator *)0x0) {
                  free(local_2f8);
                }
              }
              else {
                (*local_2d8->_vptr_Allocator[3])();
              }
            }
          }
          local_2b8 = 0;
          local_2f8 = (Allocator *)0x0;
          uStack_2f0 = 0;
          uStack_2ec = 0;
          local_2e8 = 0;
          uStack_2e4 = 0;
          local_2e0 = 0;
          local_2d0 = 0;
          uStack_2c8 = 0;
          local_2c0 = 0;
          piVar6 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_348.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_348.data != (Allocator *)0x0) {
                  free(local_348.data);
                }
              }
              else {
                (*(local_348.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_348.cstep = 0;
          local_348.data = (void *)0x0;
          local_348.refcount._0_4_ = 0;
          local_348.refcount._4_4_ = 0;
          local_348.elemsize._0_4_ = 0;
          local_348.elemsize._4_4_ = 0;
          local_348.elempack = 0;
          local_348.dims = 0;
          local_348.w = 0;
          local_348.h = 0;
          local_348.d = 0;
          local_348.c = 0;
        }
        if (100 < *(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]))
        {
          p_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          lVar16 = *(long *)(&this->field_0x298 + (long)p_Var5);
          local_348.data = (void *)(lVar16 * lVar21 + *(long *)(&this->field_0x288 + (long)p_Var5));
          local_348.elempack = *(int *)(&this->field_0x2a0 + (long)p_Var5);
          local_348.allocator = *(Allocator **)(&this->field_0x2a8 + (long)p_Var5);
          local_348.refcount._0_4_ = 0;
          local_348.refcount._4_4_ = 0;
          local_348.elemsize._0_4_ = (int)lVar16;
          local_348.elemsize._4_4_ = (int)((ulong)lVar16 >> 0x20);
          local_348.dims = 1;
          local_348.w = 1;
          local_348.h = 1;
          local_348.d = 1;
          local_348.c = 1;
          local_348.cstep = 1;
          if (piStack_128 != (int *)0x0) {
            LOCK();
            *piStack_128 = *piStack_128 + -1;
            UNLOCK();
            if (*piStack_128 == 0) {
              if (local_110 == (Allocator *)0x0) {
                if (local_130 != (void *)0x0) {
                  free(local_130);
                }
              }
              else {
                (*local_110->_vptr_Allocator[3])();
              }
            }
          }
          ppvVar11 = local_98;
          *(undefined8 *)((long)local_98 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar11 + 0x14) = 0;
          *ppvVar11 = (void *)0x0;
          ppvVar11[1] = (void *)0x0;
          puVar10 = local_a0;
          *local_a0 = 0;
          puVar10[1] = 0;
          *(undefined4 *)(puVar10 + 2) = 0;
          piVar6 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          local_130 = local_348.data;
          piStack_128 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          uStack_120 = CONCAT44(local_348.elemsize._4_4_,(int)local_348.elemsize);
          iStack_118 = local_348.elempack;
          local_110 = local_348.allocator;
          local_108 = CONCAT44(local_348.w,local_348.dims);
          uStack_100 = CONCAT44(local_348.d,local_348.h);
          local_f8 = local_348.c;
          local_f0 = local_348.cstep;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_348.allocator == (Allocator *)0x0) {
                if (local_348.data != (void *)0x0) {
                  free(local_348.data);
                }
              }
              else {
                (*(local_348.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_348.cstep = 0;
          local_348.data = (void *)0x0;
          local_348.refcount._0_4_ = 0;
          local_348.refcount._4_4_ = 0;
          local_348.elemsize._0_4_ = 0;
          local_348.elemsize._4_4_ = 0;
          local_348.elempack = 0;
          local_348.dims = 0;
          local_348.w = 0;
          local_348.h = 0;
          local_348.d = 0;
          local_348.c = 0;
        }
        in_ZMM10 = ZEXT1664(auVar37);
        in_ZMM11 = ZEXT1664(auVar38);
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_348,(Mat *)local_208);
        (*pLVar15->_vptr_Layer[3])(pLVar15,&local_348);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_348);
        lVar16 = 0xd8;
        do {
          piVar6 = *(int **)(local_208 + lVar16 + 8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (*(long **)(local_208 + lVar16 + 0x20) == (long *)0x0) {
                if (*(void **)(local_208 + lVar16) != (void *)0x0) {
                  free(*(void **)(local_208 + lVar16));
                }
              }
              else {
                (**(code **)(**(long **)(local_208 + lVar16 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_1c8 + lVar16) = 0;
          *(undefined8 *)(local_208 + lVar16 + 0xc) = 0;
          *(undefined8 *)(local_208 + lVar16 + 0x14) = 0;
          *(undefined8 *)(local_208 + lVar16) = 0;
          *(undefined8 *)(local_208 + lVar16 + 8) = 0;
          *(undefined8 *)(local_208 + lVar16 + 0x28) = 0;
          *(undefined8 *)((long)local_1d0 + lVar16 + -8) = 0;
          *(undefined4 *)((long)local_1d0 + lVar16) = 0;
          lVar16 = lVar16 + -0x48;
        } while (lVar16 != -0x48);
      }
      else {
        lVar16 = 0x40;
        auVar23._0_12_ = ZEXT812(0);
        auVar23._12_4_ = 0;
        do {
          *(undefined8 *)(local_208 + lVar16) = 0;
          *(undefined1 (*) [16])((long)&local_248 + lVar16) = auVar23;
          *(undefined1 (*) [16])(auStack_23c + lVar16) = auVar23;
          *(undefined1 (*) [16])((long)&uStack_228 + lVar16) = auVar23;
          *(undefined1 (*) [16])(auStack_21c + lVar16) = auVar23;
          lVar16 = lVar16 + 0x48;
        } while (lVar16 != 0x1a8);
        piVar6 = (int *)CONCAT44(uStack_24c,uStack_250);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(local_208._12_4_,local_208._8_4_);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if ((Allocator *)local_208._32_8_ == (Allocator *)0x0) {
              if ((void *)local_208._0_8_ != (void *)0x0) {
                free((void *)local_208._0_8_);
              }
            }
            else {
              (*(*(_func_int ***)local_208._32_8_)[3])();
            }
          }
        }
        local_208._0_8_ = local_258;
        local_208._8_4_ = uStack_250;
        local_208._12_4_ = uStack_24c;
        local_208._16_4_ = local_248;
        local_208._20_4_ = uStack_244;
        local_208._24_4_ = local_240;
        local_208._32_8_ = local_238;
        uStack_1d8 = uStack_228;
        local_208._40_8_ = local_230;
        local_1d0[0] = local_220;
        local_1c8 = local_218;
        piVar6 = (int *)CONCAT44(uStack_29c,iStack_2a0);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + 1;
          UNLOCK();
        }
        piVar6 = (int *)CONCAT44(uStack_1b4,iStack_1b8);
        if (piVar6 != (int *)0x0) {
          LOCK();
          *piVar6 = *piVar6 + -1;
          UNLOCK();
          if (*piVar6 == 0) {
            if (local_1a0 == (Allocator *)0x0) {
              if (local_1c0 != (Allocator *)0x0) {
                free(local_1c0);
              }
            }
            else {
              (*local_1a0->_vptr_Allocator[3])();
            }
          }
        }
        local_1c0 = local_2a8;
        iStack_1b8 = iStack_2a0;
        uStack_1b4 = uStack_29c;
        iStack_1b0 = local_298;
        iStack_1ac = iStack_294;
        uStack_1a8 = local_290;
        local_1a0 = local_288;
        local_198._4_4_ = iStack_27c;
        local_198._0_4_ = uStack_280;
        uStack_190._4_4_ = uStack_274;
        uStack_190._0_4_ = uStack_278;
        local_188 = uStack_270;
        local_180 = local_268;
        if (*(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) != 0)
        {
          local_348.cstep = 0;
          local_348.data = (Allocator *)0x0;
          local_348.refcount._0_4_ = 0;
          local_348.refcount._4_4_ = 0;
          local_348.elemsize._0_4_ = 0;
          local_348.elempack = 0;
          local_348.elemsize._4_4_ = (int)local_348.refcount;
          local_348.allocator = (Allocator *)local_348.data;
          local_348.dims = (int)local_348.refcount;
          local_348.w = local_348.elempack;
          local_348.h = (int)local_348.elemsize;
          local_348.d = (int)local_348.refcount;
          local_348.c = local_348.elempack;
          Mat::create(&local_348,i,4,(Allocator *)0x0);
          auVar9 = _DAT_00318660;
          auVar8 = _DAT_00318640;
          uVar13 = local_348.c * (int)local_348.cstep;
          auVar37._8_8_ = uStack_50;
          auVar37._0_8_ = local_58;
          auVar38 = vpcmpeqd_avx(auVar38,auVar38);
          if (0 < (int)uVar13) {
            auVar25._8_8_ = 0;
            auVar25._0_8_ = (ulong)uVar13 - 1;
            auVar24 = vpshufd_avx(auVar25,0x44);
            uVar1 = *(undefined4 *)
                     (*(long *)(&this->field_0x1f8 +
                               (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]) + lVar21 * 4);
            auVar27._4_4_ = uVar1;
            auVar27._0_4_ = uVar1;
            auVar27._8_4_ = uVar1;
            auVar27._12_4_ = uVar1;
            auVar27._16_4_ = uVar1;
            auVar27._20_4_ = uVar1;
            auVar27._24_4_ = uVar1;
            auVar27._28_4_ = uVar1;
            uVar18 = 0;
            do {
              auVar29._8_8_ = 0;
              auVar29._0_8_ = uVar18;
              auVar7 = vpshufd_avx(auVar29,0x44);
              auVar31._16_16_ = auVar7;
              auVar31._0_16_ = auVar7;
              auVar28 = vorps_avx(auVar8,auVar31);
              auVar34 = vorps_avx(auVar9,auVar31);
              auVar7 = vpcmpgtq_avx(auVar37 ^ auVar34._16_16_,auVar37 ^ auVar24);
              auVar26 = vpcmpgtq_avx(auVar37 ^ auVar34._0_16_,auVar37 ^ auVar24);
              auVar7 = vpackssdw_avx(auVar26,auVar7);
              auVar26 = vpcmpgtq_avx(auVar37 ^ auVar28._16_16_,auVar37 ^ auVar24);
              auVar35._0_4_ = (uint)local_58 ^ auVar28._0_4_;
              auVar35._4_4_ = (uint)((ulong)local_58 >> 0x20) ^ auVar28._4_4_;
              auVar35._8_4_ = (uint)uStack_50 ^ auVar28._8_4_;
              auVar35._12_4_ = (uint)((ulong)uStack_50 >> 0x20) ^ auVar28._12_4_;
              auVar30 = vpcmpgtq_avx(auVar35,auVar37 ^ auVar24);
              auVar26 = vpackssdw_avx(auVar30,auVar26);
              auVar7 = vpackssdw_avx(auVar38 ^ auVar26,auVar38 ^ auVar7);
              auVar26 = vpmovsxwd_avx(auVar7);
              auVar7 = vpunpckhwd_avx(auVar7,auVar7);
              auVar32._16_16_ = auVar7;
              auVar32._0_16_ = auVar26;
              auVar28 = vmaskmovps_avx(auVar32,auVar27);
              *(undefined1 (*) [32])((long)(_func_int ***)local_348.data + uVar18 * 4) = auVar28;
              uVar18 = uVar18 + 8;
            } while ((uVar13 + 7 & 0xfffffff8) != uVar18);
          }
          piVar6 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + 1;
            UNLOCK();
          }
          if (piStack_170 != (int *)0x0) {
            LOCK();
            *piStack_170 = *piStack_170 + -1;
            UNLOCK();
            if (*piStack_170 == 0) {
              if (local_158 == (Allocator *)0x0) {
                if (local_178 != (Allocator *)0x0) {
                  free(local_178);
                }
              }
              else {
                (*local_158->_vptr_Allocator[3])();
              }
            }
          }
          ppAVar12 = local_88;
          *(undefined8 *)((long)local_88 + 0xc) = 0;
          *(undefined8 *)((long)ppAVar12 + 0x14) = 0;
          *ppAVar12 = (Allocator *)0x0;
          ppAVar12[1] = (Allocator *)0x0;
          puVar10 = local_90;
          *local_90 = 0;
          puVar10[1] = 0;
          *(undefined4 *)(puVar10 + 2) = 0;
          piStack_170 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          local_178 = (Allocator *)local_348.data;
          uStack_168 = CONCAT44(local_348.elemsize._4_4_,(int)local_348.elemsize);
          iStack_160 = local_348.elempack;
          local_158 = local_348.allocator;
          local_150 = CONCAT44(local_348.w,local_348.dims);
          uStack_148 = CONCAT44(local_348.d,local_348.h);
          local_140 = local_348.c;
          local_138 = local_348.cstep;
          p_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          lVar16 = *(long *)(&this->field_0x250 + (long)p_Var5);
          local_2f8 = (Allocator *)(lVar16 * lVar21 + *(long *)(&this->field_0x240 + (long)p_Var5));
          local_2e0 = *(int *)(&this->field_0x258 + (long)p_Var5);
          local_2d8 = *(Allocator **)(&this->field_0x260 + (long)p_Var5);
          uStack_2f0 = 0;
          uStack_2ec = 0;
          local_2e8 = (undefined4)lVar16;
          uStack_2e4 = (undefined4)((ulong)lVar16 >> 0x20);
          local_2d0 = 0x100000001;
          uStack_2c8 = 0x100000001;
          local_2c0 = 1;
          local_2b8 = 1;
          if (piStack_128 != (int *)0x0) {
            LOCK();
            *piStack_128 = *piStack_128 + -1;
            UNLOCK();
            if (*piStack_128 == 0) {
              if (local_110 == (Allocator *)0x0) {
                if (local_130 != (void *)0x0) {
                  free(local_130);
                }
              }
              else {
                (*local_110->_vptr_Allocator[3])();
              }
            }
          }
          ppvVar11 = local_98;
          *(undefined8 *)((long)local_98 + 0xc) = 0;
          *(undefined8 *)((long)ppvVar11 + 0x14) = 0;
          *ppvVar11 = (void *)0x0;
          ppvVar11[1] = (void *)0x0;
          puVar10 = local_a0;
          *local_a0 = 0;
          puVar10[1] = 0;
          *(undefined4 *)(puVar10 + 2) = 0;
          piVar6 = (int *)CONCAT44(uStack_2ec,uStack_2f0);
          local_130 = local_2f8;
          piStack_128 = (int *)CONCAT44(uStack_2ec,uStack_2f0);
          uStack_120 = CONCAT44(uStack_2e4,local_2e8);
          iStack_118 = local_2e0;
          local_110 = local_2d8;
          local_108 = local_2d0;
          uStack_100 = uStack_2c8;
          local_f8 = local_2c0;
          local_f0 = local_2b8;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_2d8 == (Allocator *)0x0) {
                if (local_2f8 != (Allocator *)0x0) {
                  free(local_2f8);
                }
              }
              else {
                (*local_2d8->_vptr_Allocator[3])();
              }
            }
          }
          local_2b8 = 0;
          local_2f8 = (Allocator *)0x0;
          uStack_2f0 = 0;
          uStack_2ec = 0;
          local_2e8 = 0;
          uStack_2e4 = 0;
          local_2e0 = 0;
          local_2d0 = 0;
          uStack_2c8 = 0;
          local_2c0 = 0;
          piVar6 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_348.allocator == (Allocator *)0x0) {
                if ((Allocator *)local_348.data != (Allocator *)0x0) {
                  free(local_348.data);
                }
              }
              else {
                (*(local_348.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_348.cstep = 0;
          local_348.data = (void *)0x0;
          local_348.refcount._0_4_ = 0;
          local_348.refcount._4_4_ = 0;
          local_348.elemsize._0_4_ = 0;
          local_348.elemsize._4_4_ = 0;
          local_348.elempack = 0;
          local_348.dims = 0;
          local_348.w = 0;
          local_348.h = 0;
          local_348.d = 0;
          local_348.c = 0;
        }
        if (100 < *(int *)(&this->field_0x10c + (long)this->_vptr_ConvolutionDepthWise_x86_avx[-3]))
        {
          p_Var5 = this->_vptr_ConvolutionDepthWise_x86_avx[-3];
          lVar16 = *(long *)(&this->field_0x298 + (long)p_Var5);
          local_348.data = (void *)(lVar16 * lVar21 + *(long *)(&this->field_0x288 + (long)p_Var5));
          local_348.elempack = *(int *)(&this->field_0x2a0 + (long)p_Var5);
          local_348.allocator = *(Allocator **)(&this->field_0x2a8 + (long)p_Var5);
          local_348.refcount._0_4_ = 0;
          local_348.refcount._4_4_ = 0;
          local_348.elemsize._0_4_ = (int)lVar16;
          local_348.elemsize._4_4_ = (int)((ulong)lVar16 >> 0x20);
          local_348.dims = 1;
          local_348.w = 1;
          local_348.h = 1;
          local_348.d = 1;
          local_348.c = 1;
          local_348.cstep = 1;
          piVar6 = (int *)CONCAT44(uStack_dc,uStack_e0);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_c8 == (Allocator *)0x0) {
                if (local_e8 != (void *)0x0) {
                  free(local_e8);
                }
              }
              else {
                (*local_c8->_vptr_Allocator[3])();
              }
            }
          }
          piVar6 = (int *)CONCAT44(local_348.refcount._4_4_,(int)local_348.refcount);
          local_e8 = local_348.data;
          uStack_e0 = (int)local_348.refcount;
          uStack_dc = local_348.refcount._4_4_;
          uStack_d8 = (int)local_348.elemsize;
          uStack_d4 = local_348.elemsize._4_4_;
          iStack_d0 = local_348.elempack;
          local_c8 = local_348.allocator;
          local_c0 = CONCAT44(local_348.w,local_348.dims);
          uStack_b8 = CONCAT44(local_348.d,local_348.h);
          local_b0 = local_348.c;
          local_a8 = local_348.cstep;
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (local_348.allocator == (Allocator *)0x0) {
                if (local_348.data != (void *)0x0) {
                  free(local_348.data);
                }
              }
              else {
                (*(local_348.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          local_348.cstep = 0;
          local_348.data = (void *)0x0;
          local_348.refcount._0_4_ = 0;
          local_348.refcount._4_4_ = 0;
          local_348.elemsize._0_4_ = 0;
          local_348.elemsize._4_4_ = 0;
          local_348.elempack = 0;
          local_348.dims = 0;
          local_348.w = 0;
          local_348.h = 0;
          local_348.d = 0;
          local_348.c = 0;
        }
        in_ZMM10 = ZEXT1664(auVar37);
        in_ZMM11 = ZEXT1664(auVar38);
        ModelBinFromMatArray::ModelBinFromMatArray
                  ((ModelBinFromMatArray *)&local_348,(Mat *)local_208);
        (*pLVar15->_vptr_Layer[3])(pLVar15,&local_348);
        ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)&local_348);
        lVar16 = 0x120;
        do {
          piVar6 = *(int **)(local_208 + lVar16 + 8);
          if (piVar6 != (int *)0x0) {
            LOCK();
            *piVar6 = *piVar6 + -1;
            UNLOCK();
            if (*piVar6 == 0) {
              if (*(long **)(local_208 + lVar16 + 0x20) == (long *)0x0) {
                if (*(void **)(local_208 + lVar16) != (void *)0x0) {
                  free(*(void **)(local_208 + lVar16));
                }
              }
              else {
                (**(code **)(**(long **)(local_208 + lVar16 + 0x20) + 0x18))();
              }
            }
          }
          *(undefined8 *)((long)&local_1c8 + lVar16) = 0;
          *(undefined8 *)(local_208 + lVar16 + 0xc) = 0;
          *(undefined8 *)(local_208 + lVar16 + 0x14) = 0;
          *(undefined8 *)(local_208 + lVar16) = 0;
          *(undefined8 *)(local_208 + lVar16 + 8) = 0;
          *(undefined8 *)(local_208 + lVar16 + 0x28) = 0;
          *(undefined8 *)((long)local_1d0 + lVar16 + -8) = 0;
          *(undefined4 *)((long)local_1d0 + lVar16) = 0;
          lVar16 = lVar16 + -0x48;
        } while (lVar16 != -0x48);
      }
      (*pLVar15->_vptr_Layer[4])(pLVar15,local_60);
      (local_80->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
      super__Vector_impl_data._M_start[lVar21] = pLVar15;
      ParamDict::~ParamDict(&local_40);
      piVar6 = (int *)CONCAT44(uStack_29c,iStack_2a0);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_288 == (Allocator *)0x0) {
            if (local_2a8 != (Allocator *)0x0) {
              free(local_2a8);
            }
          }
          else {
            (*local_288->_vptr_Allocator[3])();
          }
        }
      }
      local_268 = 0;
      local_2a8 = (Allocator *)0x0;
      iStack_2a0 = 0;
      uStack_29c = 0;
      local_298 = 0;
      iStack_294 = 0;
      local_290 = 0;
      uStack_280 = 0;
      iStack_27c = 0;
      uStack_278 = 0;
      uStack_274 = 0;
      uStack_270 = 0;
      piVar6 = (int *)CONCAT44(uStack_24c,uStack_250);
      if (piVar6 != (int *)0x0) {
        LOCK();
        *piVar6 = *piVar6 + -1;
        UNLOCK();
        if (*piVar6 == 0) {
          if (local_238 == (Allocator *)0x0) {
            if (local_258 != (void *)0x0) {
              free(local_258);
            }
          }
          else {
            (*local_238->_vptr_Allocator[3])();
          }
        }
      }
      lVar21 = lVar21 + 1;
      pp_Var17 = this->_vptr_ConvolutionDepthWise_x86_avx;
    } while (lVar21 < *(int *)(&this->field_0x108 + (long)pp_Var17[-3]));
  }
  return 0;
}

Assistant:

int ConvolutionDepthWise_x86_avx::create_group_ops(const Option& opt)
{
    // create Convolution op for each group
    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    for (int i = 0; i < (int)group_ops.size(); i++)
        delete group_ops[i];

    group_ops.clear();

    const int channels_g = channels / group;
    const int num_output_g = num_output / group;

    group_ops.resize(group);

    for (int g = 0; g < group; g++)
    {
        Mat weight_data_g = weight_data.range(maxk * channels_g * num_output_g * g, maxk * channels_g * num_output_g);
        Mat bias_data_g;
        if (bias_term)
            bias_data_g = bias_data.range(num_output_g * g, num_output_g);

        ncnn::Layer* op = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output_g); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, dilation_w);
        pd.set(12, dilation_h);
        pd.set(3, stride_w);
        pd.set(13, stride_h);
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, maxk * channels_g * num_output_g); // weight_data_size
        pd.set(8, int8_scale_term);
        pd.set(9, activation_type);
        pd.set(10, activation_params);

        op->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[5];
            weights[0] = weight_data_g;
            weights[1] = bias_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[2] = weight_data_int8_scales_g;
                weights[3] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[4] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[4];
            weights[0] = weight_data_g;

#if NCNN_INT8
            if (int8_scale_term)
            {
                Mat weight_data_int8_scales_g(num_output_g);
                weight_data_int8_scales_g.fill(weight_data_int8_scales[g]);
                weights[1] = weight_data_int8_scales_g;
                weights[2] = bottom_blob_int8_scales.range(g, 1);
            }
            if (int8_scale_term > 100)
            {
                weights[3] = top_blob_int8_scales.range(g, 1);
            }
#endif

            op->load_model(ModelBinFromMatArray(weights));
        }

        op->create_pipeline(opt);

        group_ops[g] = op;
    }

    return 0;
}